

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall
HEkk::proofOfPrimalInfeasibility(HEkk *this,HVector *row_ep,HighsInt move_out,HighsInt row_out)

{
  double *pdVar1;
  bool bVar2;
  uint *puVar3;
  reference pvVar4;
  size_type sVar5;
  string *message;
  reference pvVar6;
  reference pvVar7;
  int in_EDX;
  long in_RSI;
  char *pcVar8;
  long in_RDI;
  vector<double,_std::allocator<double>_> *pvVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar10;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double local_report;
  bool proof_of_primal_infeasibility;
  bool gap_ok;
  double gap;
  bool infinite_implied_upper;
  double value_1;
  HighsInt iCol_1;
  HighsInt i_1;
  HighsCDouble sumInf;
  HighsCDouble implied_upper;
  double abs_value;
  double value;
  HighsInt iCol;
  HighsInt i;
  double max_basic_proof_value;
  HighsInt num_basic_proof_report;
  HighsInt proof_num_nz;
  vector<int,_std::allocator<int>_> *proof_index;
  vector<double,_std::allocator<double>_> *proof_value;
  double abs_row_ep_value_2;
  double abs_row_ep_value_1;
  double rowBound;
  double abs_row_ep_value;
  double row_ep_value;
  HighsInt iRow;
  HighsInt iX;
  double max_zeroed_for_ub_value;
  HighsInt num_zeroed_for_ub_report;
  double max_zeroed_for_lb_value;
  HighsInt num_zeroed_for_lb_report;
  double max_zeroed_for_small_value;
  HighsInt num_zeroed_for_small_report;
  HighsInt max_num_zeroed_report;
  HighsInt max_num_basic_proof_report;
  HighsCDouble proof_lower;
  double row_ep_scale;
  bool use_iterative_refinement;
  bool use_row_wise_matrix;
  bool debug_proof_report;
  bool debug_rows_report;
  bool debug_proof_report_on;
  HighsInt debug_product_report;
  HighsLp *lp;
  HighsCDouble *in_stack_fffffffffffffd38;
  HighsCDouble *in_stack_fffffffffffffd40;
  double in_stack_fffffffffffffd48;
  HighsCDouble *in_stack_fffffffffffffd50;
  HighsInt in_stack_fffffffffffffd5c;
  HEkk *in_stack_fffffffffffffd60;
  bool local_291;
  undefined4 in_stack_fffffffffffffd84;
  undefined1 force;
  HVector *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  HighsInt offset;
  allocator *this_00;
  HSimplexNla *this_01;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc8;
  HighsInt in_stack_fffffffffffffdd4;
  string *in_stack_fffffffffffffdd8;
  HSimplexNla *in_stack_fffffffffffffde0;
  HighsCDouble local_1d0;
  double local_1c0;
  byte local_1b1;
  double local_1b0;
  int local_1a8;
  int local_1a4;
  HighsCDouble local_1a0;
  HighsCDouble local_190;
  undefined8 in_stack_fffffffffffffe80;
  HighsInt debug_report;
  double dVar11;
  HVector *in_stack_fffffffffffffe88;
  value_type vVar12;
  undefined4 in_stack_fffffffffffffe90;
  uint uVar13;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar14;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int iVar15;
  allocator local_121;
  string local_120 [55];
  undefined1 local_e9 [37];
  uint local_c4;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  value_type local_90;
  uint local_88;
  int local_84;
  double local_80;
  int local_74;
  double local_70;
  int local_64;
  double local_60;
  int local_54;
  undefined4 local_50;
  undefined4 local_4c;
  HighsCDouble local_48;
  undefined8 local_38;
  undefined1 local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  undefined1 local_25;
  undefined4 local_24;
  long local_20;
  int local_14;
  long local_10;
  
  local_20 = in_RDI + 0x2198;
  local_25 = 1;
  local_27 = (*(byte *)(in_RDI + 0x3871) & 1) != 0;
  local_24 = 0xfffffffe;
  local_28 = *(byte *)(in_RDI + 0x2555) & 1;
  local_29 = 0;
  local_38 = 0;
  local_26 = local_27;
  local_14 = in_EDX;
  local_10 = in_RSI;
  HighsCDouble::HighsCDouble(&local_48,0.0);
  local_4c = 0x19;
  local_50 = 0x19;
  local_54 = 0;
  local_60 = 0.0;
  local_64 = 0;
  local_70 = 0.0;
  local_74 = 0;
  local_80 = 0.0;
  local_84 = 0;
  while( true ) {
    offset = (HighsInt)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    force = (undefined1)((uint)in_stack_fffffffffffffd84 >> 0x18);
    debug_report = (HighsInt)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    if (*(int *)(local_10 + 4) <= local_84) break;
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_10 + 8),(long)local_84);
    local_88 = *puVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                        (long)(int)local_88);
    iVar15 = (int)in_RDI;
    local_90 = *pvVar4;
    getMaxAbsRowValue(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    std::abs(iVar15);
    if (*(double *)(*(long *)(in_RDI + 8) + 0x108) < extraout_XMM0_Qa) {
      dVar10 = (double)local_14;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                          (long)(int)local_88);
      *pvVar4 = dVar10 * *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                          (long)(int)local_88);
      if (*pvVar4 <= 0.0) {
        pvVar9 = (vector<double,_std::allocator<double>_> *)(local_20 + 0x68);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar9,(long)(int)local_88);
        iVar15 = (int)pvVar9;
        local_a0 = *pvVar4;
        bVar2 = highs_isInfinity(local_a0);
        if (!bVar2) goto LAB_00776adb;
        if ((((local_27 & 1) != 0) && (std::abs(iVar15), local_74 < 0x19)) &&
           (local_80 < extraout_XMM0_Qa_02)) {
          local_b0 = extraout_XMM0_Qa_02;
          printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite upper bound\n",local_90,
                 (ulong)local_88);
          local_74 = local_74 + 1;
          local_80 = local_b0;
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                            (long)(int)local_88);
        *pvVar4 = 0.0;
      }
      else {
        pvVar9 = (vector<double,_std::allocator<double>_> *)(local_20 + 0x50);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar9,(long)(int)local_88);
        iVar15 = (int)pvVar9;
        local_a0 = *pvVar4;
        bVar2 = highs_isInfinity(-local_a0);
        if (bVar2) {
          if ((((local_27 & 1) != 0) && (std::abs(iVar15), local_64 < 0x19)) &&
             (local_70 < extraout_XMM0_Qa_01)) {
            local_a8 = extraout_XMM0_Qa_01;
            printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite lower bound\n",local_90,
                   (ulong)local_88);
            local_64 = local_64 + 1;
            local_70 = local_a8;
          }
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                              (long)(int)local_88);
          *pvVar4 = 0.0;
        }
        else {
LAB_00776adb:
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                     (long)(int)local_88);
          HighsCDouble::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
      }
    }
    else {
      if ((((local_27 & 1) != 0) && (std::abs(iVar15), local_54 < 0x19)) &&
         (local_60 < extraout_XMM0_Qa_00)) {
        local_98 = extraout_XMM0_Qa_00;
        printf("Zeroed row_ep.array[%6d] = %11.4g due to being small in contribution\n",local_90,
               (ulong)local_88);
        local_54 = local_54 + 1;
        local_60 = local_98;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                          (long)(int)local_88);
      *pvVar4 = 0.0;
    }
    local_84 = local_84 + 1;
  }
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x776b38);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x776b4c);
  local_b8 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x3730);
  local_c0 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x3718);
  if ((local_28 & 1) == 0) {
    HighsSparseMatrix::productTransposeQuad
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,debug_report);
  }
  else {
    HighsSparseMatrix::productTransposeQuad
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,debug_report);
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size(local_c0);
  local_c4 = (uint)sVar5;
  if ((local_26 & 1) != 0) {
    message = (string *)(in_RDI + 0x2b38);
    this_01 = (HSimplexNla *)local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e9 + 1),"Row e_p",(allocator *)this_01);
    HSimplexNla::reportArray(this_01,message,offset,in_stack_fffffffffffffd88,(bool)force);
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
    pvVar9 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2b38);
    this_00 = &local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"Proof",this_00);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_00,pvVar9);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_00,
               (vector<int,_std::allocator<int>_> *)pvVar9);
    HSimplexNla::reportVector
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
               in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,SUB81((ulong)in_RDI >> 0x38,0));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  if ((local_27 & 1) != 0) {
    printf("HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = %d; row_ep_scale = %g\n"
           ,local_38,(ulong)*(uint *)(local_10 + 4),(ulong)local_c4);
    iVar15 = 0;
    dVar10 = 0.0;
    for (uVar14 = 0; (int)uVar14 < (int)local_c4; uVar14 = uVar14 + 1) {
      puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (local_c0,(long)(int)uVar14);
      uVar13 = *puVar3;
      pvVar9 = local_b8;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_b8,(long)(int)uVar14);
      vVar12 = *pvVar4;
      std::abs((int)pvVar9);
      dVar11 = extraout_XMM0_Qa_03;
      pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                          (long)(int)uVar13);
      if (((*pvVar6 == '\0') && (dVar10 < dVar11)) && (iVar15 < 0x19)) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",vVar12,(ulong)uVar14,
               (ulong)uVar13);
        iVar15 = iVar15 + 1;
        dVar10 = dVar11;
      }
    }
  }
  HighsCDouble::HighsCDouble(&local_190,0.0);
  HighsCDouble::HighsCDouble(&local_1a0,0.0);
  for (local_1a4 = 0; local_1a4 < (int)local_c4; local_1a4 = local_1a4 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_c0,(long)local_1a4);
    local_1a8 = *pvVar7;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_b8,(long)local_1a4);
    local_1b0 = *pvVar4;
    if (local_1b0 <= 0.0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                          (long)local_1a8);
      bVar2 = highs_isInfinity(-*pvVar4);
      if (bVar2) {
        HighsCDouble::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38)
        ;
        if (bVar2) break;
      }
      else {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),(long)local_1a8);
        HighsCDouble::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),
                          (long)local_1a8);
      bVar2 = highs_isInfinity(*pvVar4);
      if (bVar2) {
        HighsCDouble::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38)
        ;
        if (bVar2) break;
      }
      else {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_20 + 0x38),(long)local_1a8);
        HighsCDouble::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
    }
  }
  local_1b1 = HighsCDouble::operator>(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
  local_1d0 = HighsCDouble::operator-(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_1c0 = HighsCDouble::operator_cast_to_double(&local_1d0);
  pdVar1 = (double *)(*(long *)(in_RDI + 8) + 0x118);
  local_291 = (local_1b1 & 1) == 0 && (*pdVar1 <= local_1c0 && local_1c0 != *pdVar1);
  if ((local_27 & 1) != 0) {
    pcVar8 = "";
    if ((local_1b1 & 1) != 0) {
      pcVar8 = "in";
    }
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",pcVar8);
    if ((local_1b1 & 1) == 0) {
      printf(" and gap = %g",local_1c0);
    }
    pcVar8 = "false";
    if (local_291) {
      pcVar8 = "true";
    }
    printf(" so proof is %s\n",pcVar8);
  }
  return local_291;
}

Assistant:

bool HEkk::proofOfPrimalInfeasibility(HVector& row_ep, const HighsInt move_out,
                                      const HighsInt row_out) {
  // To be called from inside HEkkDual
  HighsLp& lp = this->lp_;

  HighsInt debug_product_report = kDebugReportOff;
  const bool debug_proof_report_on = true;
  bool debug_rows_report = false;
  bool debug_proof_report = false;
  if (debug_iteration_report_) {
    if (debug_proof_report_on)
      debug_product_report = kDebugReportOff;  // kDebugReportAll; //
    debug_rows_report = debug_proof_report_on;
    debug_proof_report = debug_proof_report_on;
  }

  const bool use_row_wise_matrix = status_.has_ar_matrix;
  const bool use_iterative_refinement = false;  // debug_iteration_report_;//
  if (use_iterative_refinement) {
    simplex_nla_.reportArray("Row e_p.0", lp.num_col_, &row_ep, true);
    unitBtranIterativeRefinement(row_out, row_ep);
    simplex_nla_.reportArray("Row e_p.1", lp.num_col_, &row_ep, true);
  }

  // Refine row_ep by removing relatively small values
  double row_ep_scale = 0;
  // if (use_refinement) refineArray(row_ep, row_ep_scale,
  // refinement_tolerance);
  // Determine the maximum absolute value in row_ep
  HighsCDouble proof_lower = 0.0;
  const HighsInt max_num_basic_proof_report = 25;
  const HighsInt max_num_zeroed_report = 25;
  HighsInt num_zeroed_for_small_report = 0;
  double max_zeroed_for_small_value = 0;
  HighsInt num_zeroed_for_lb_report = 0;
  double max_zeroed_for_lb_value = 0;
  HighsInt num_zeroed_for_ub_report = 0;
  double max_zeroed_for_ub_value = 0;
  for (HighsInt iX = 0; iX < row_ep.count; iX++) {
    HighsInt iRow = row_ep.index[iX];
    // Give row_ep the sign of the leaving row - as is done in
    // getDualRayInterface.
    const double row_ep_value = row_ep.array[iRow];
    assert(row_ep_value);
    if (std::abs(row_ep_value * getMaxAbsRowValue(iRow)) <=
        options_->small_matrix_value) {
      if (debug_proof_report) {
        const double abs_row_ep_value = std::abs(row_ep_value);
        if (num_zeroed_for_small_report < max_num_zeroed_report &&
            max_zeroed_for_small_value < abs_row_ep_value) {
          printf(
              "Zeroed row_ep.array[%6d] = %11.4g due to being small in "
              "contribution\n",
              (int)iRow, row_ep_value);
          num_zeroed_for_small_report++;
          max_zeroed_for_small_value = abs_row_ep_value;
        }
      }
      row_ep.array[iRow] = 0.0;
      continue;
    }

    row_ep.array[iRow] *= move_out;

    // make sure infinite sides are not used
    double rowBound;
    if (row_ep.array[iRow] > 0) {
      rowBound = lp.row_lower_[iRow];
      if (highs_isInfinity(-rowBound)) {
        // row lower bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_lb_report < max_num_zeroed_report &&
              max_zeroed_for_lb_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite lower "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_lb_report++;
            max_zeroed_for_lb_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }

    } else {
      rowBound = lp.row_upper_[iRow];
      if (highs_isInfinity(rowBound)) {
        // row upper bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_ub_report < max_num_zeroed_report &&
              max_zeroed_for_ub_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite upper "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_ub_report++;
            max_zeroed_for_ub_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }
    }
    // add up lower bound of proof constraint
    proof_lower += row_ep.array[iRow] * rowBound;
  }
  // Form the proof constraint coefficients
  proof_value_.clear();
  proof_index_.clear();
  vector<double>& proof_value = this->proof_value_;
  vector<HighsInt>& proof_index = this->proof_index_;
  if (use_row_wise_matrix) {
    this->ar_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                          debug_product_report);
  } else {
    lp.a_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                      debug_product_report);
  }

  HighsInt proof_num_nz = proof_index.size();
  if (debug_rows_report) {
    simplex_nla_.reportArray("Row e_p", lp.num_col_, &row_ep, true);
    simplex_nla_.reportVector("Proof", proof_num_nz, proof_value, proof_index,
                              true);
  }
  if (debug_proof_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = "
        "%d; row_ep_scale = %g\n",
        (int)row_ep.count, (int)proof_num_nz, row_ep_scale);
    HighsInt num_basic_proof_report = 0;
    double max_basic_proof_value = 0;
    for (HighsInt i = 0; i < proof_num_nz; ++i) {
      const HighsInt iCol = proof_index[i];
      const double value = proof_value[i];
      const double abs_value = std::abs(value);
      if (!basis_.nonbasicFlag_[iCol] && max_basic_proof_value < abs_value &&
          num_basic_proof_report < max_num_basic_proof_report) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",
               (int)i, (int)iCol, value);
        max_basic_proof_value = abs_value;
        num_basic_proof_report++;
      }
    }
  }
  HighsCDouble implied_upper = 0.0;
  HighsCDouble sumInf = 0.0;
  for (HighsInt i = 0; i < proof_num_nz; ++i) {
    const HighsInt iCol = proof_index[i];
    const double value = proof_value[i];
    if (value > 0) {
      if (highs_isInfinity(lp.col_upper_[iCol])) {
        sumInf += value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
        // Commented out unreachable code
        //        if (value <= options_->small_matrix_value) continue;
      }
      implied_upper += value * lp.col_upper_[iCol];
    } else {
      if (highs_isInfinity(-lp.col_lower_[iCol])) {
        sumInf += -value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
      }
      implied_upper += value * lp.col_lower_[iCol];
    }
  }
  bool infinite_implied_upper = sumInf > options_->small_matrix_value;
  const double gap = double(proof_lower - implied_upper);
  const bool gap_ok = gap > options_->primal_feasibility_tolerance;
  const bool proof_of_primal_infeasibility = !infinite_implied_upper && gap_ok;

  const double local_report = false;
  if (!proof_of_primal_infeasibility && local_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility: row %6d; gap = %11.4g (%s); "
        "sumInf = %11.4g (%s) so proof is %s\n",
        (int)row_out, gap, highsBoolToString(gap_ok).c_str(), (double)sumInf,
        highsBoolToString(infinite_implied_upper).c_str(),
        highsBoolToString(proof_of_primal_infeasibility).c_str());
  }
  if (debug_proof_report) {
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",
           infinite_implied_upper ? "in" : "");
    if (!infinite_implied_upper) printf(" and gap = %g", gap);
    printf(" so proof is %s\n",
           proof_of_primal_infeasibility ? "true" : "false");
  }
  return proof_of_primal_infeasibility;
}